

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.c
# Opt level: O0

char * conf_get_str_str_opt(Conf *conf,int primary,char *secondary)

{
  void *pvVar1;
  char *local_40;
  conf_entry *entry;
  key key;
  char *secondary_local;
  int primary_local;
  Conf *conf_local;
  
  key.secondary.s = secondary;
  if (subkeytypes[primary] != 3) {
    __assert_fail("subkeytypes[primary] == TYPE_STR",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/conf.c",
                  0x143,"char *conf_get_str_str_opt(Conf *, int, const char *)");
  }
  if (valuetypes[primary] == 3) {
    entry._0_4_ = primary;
    key._0_8_ = secondary;
    pvVar1 = find234(conf->tree,&entry,(cmpfn234)0x0);
    if (pvVar1 == (void *)0x0) {
      local_40 = (char *)0x0;
    }
    else {
      local_40 = *(char **)((long)pvVar1 + 0x10);
    }
    return local_40;
  }
  __assert_fail("valuetypes[primary] == TYPE_STR",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/conf.c",
                0x144,"char *conf_get_str_str_opt(Conf *, int, const char *)");
}

Assistant:

char *conf_get_str_str_opt(Conf *conf, int primary, const char *secondary)
{
    struct key key;
    struct conf_entry *entry;

    assert(subkeytypes[primary] == TYPE_STR);
    assert(valuetypes[primary] == TYPE_STR);
    key.primary = primary;
    key.secondary.s = (char *)secondary;
    entry = find234(conf->tree, &key, NULL);
    return entry ? entry->value.u.stringval : NULL;
}